

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

bool duckdb::Date::IsValid(int32_t year,int32_t month,int32_t day)

{
  undefined1 *puVar1;
  uint uVar2;
  bool bVar3;
  
  if (((0 < day && 0xfffffff3 < month - 0xdU) &&
      ((-0x59af89 < year || ((5 < month && year == -0x59af89 && (month != 6 || 0x18 < day)))))) &&
     ((year < 0x59beec || ((month < 8 && year == 0x59beec && (month != 7 || day < 0xb)))))) {
    if ((year & 3U) == 0) {
      uVar2 = year * -0x3d70a3d7 + 0x51eb850;
      bVar3 = true;
      if ((uVar2 >> 2 | year * 0x40000000) < 0x28f5c29) {
        bVar3 = (uVar2 >> 4 | year * -0x70000000) < 0xa3d70b;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
      puVar1 = LEAP_DAYS;
    }
    else {
      puVar1 = NORMAL_DAYS;
    }
    return day <= *(int *)(puVar1 + (ulong)(uint)month * 4);
  }
  return false;
}

Assistant:

bool Date::IsValid(int32_t year, int32_t month, int32_t day) {
	if (month < 1 || month > 12) {
		return false;
	}
	if (day < 1) {
		return false;
	}
	if (year <= DATE_MIN_YEAR) {
		if (year < DATE_MIN_YEAR) {
			return false;
		} else if (year == DATE_MIN_YEAR) {
			if (month < DATE_MIN_MONTH || (month == DATE_MIN_MONTH && day < DATE_MIN_DAY)) {
				return false;
			}
		}
	}
	if (year >= DATE_MAX_YEAR) {
		if (year > DATE_MAX_YEAR) {
			return false;
		} else if (year == DATE_MAX_YEAR) {
			if (month > DATE_MAX_MONTH || (month == DATE_MAX_MONTH && day > DATE_MAX_DAY)) {
				return false;
			}
		}
	}
	return Date::IsLeapYear(year) ? day <= Date::LEAP_DAYS[month] : day <= Date::NORMAL_DAYS[month];
}